

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_descent(tree *t)

{
  wchar_t fd;
  int *piVar1;
  wchar_t local_1c;
  wchar_t r;
  wchar_t new_fd;
  wchar_t flag;
  tree *t_local;
  
  local_1c = L'\0';
  t->dirname_length = (t->path).length;
  fd = open_on_current_dir(t,(t->stack->name).s,L'\x00090000');
  __archive_ensure_cloexec_flag(fd);
  if (fd < L'\0') {
    piVar1 = __errno_location();
    t->tree_errno = *piVar1;
    local_1c = L'\xffffffff';
  }
  else {
    t->depth = t->depth + 1;
    if ((t->stack->flags & 2U) == 0) {
      close(t->working_dir_fd);
    }
    else {
      t->stack->symlink_parent_fd = t->working_dir_fd;
      t->openCount = t->openCount + 1;
      if (t->maxOpenCount < t->openCount) {
        t->maxOpenCount = t->openCount;
      }
    }
    t->working_dir_fd = fd;
    t->flags = t->flags & 0xffffffbf;
  }
  return local_1c;
}

Assistant:

static int
tree_descent(struct tree *t)
{
	int flag, new_fd, r = 0;

	t->dirname_length = archive_strlen(&t->path);
	flag = O_RDONLY | O_CLOEXEC;
#if defined(O_DIRECTORY)
	flag |= O_DIRECTORY;
#endif
	new_fd = open_on_current_dir(t, t->stack->name.s, flag);
	__archive_ensure_cloexec_flag(new_fd);
	if (new_fd < 0) {
		t->tree_errno = errno;
		r = TREE_ERROR_DIR;
	} else {
		t->depth++;
		/* If it is a link, set up fd for the ascent. */
		if (t->stack->flags & isDirLink) {
			t->stack->symlink_parent_fd = t->working_dir_fd;
			t->openCount++;
			if (t->openCount > t->maxOpenCount)
				t->maxOpenCount = t->openCount;
		} else
			close(t->working_dir_fd);
		/* Renew the current working directory. */
		t->working_dir_fd = new_fd;
		t->flags &= ~onWorkingDir;
	}
	return (r);
}